

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O2

void __thiscall gmlc::networking::AsioContextManager::haltContextLoop(AsioContextManager *this)

{
  atomic<int> *paVar1;
  int iVar2;
  future_status fVar3;
  rep in_RAX;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  
  if ((this->running)._M_i == stopped) {
    LOCK();
    (this->runCounter).super___atomic_base<int>._M_i = 0;
    UNLOCK();
  }
  else {
    LOCK();
    paVar1 = &this->runCounter;
    iVar2 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if (iVar2 + -1 < 1) {
      local_28.__r = in_RAX;
      std::mutex::lock(&this->runningLoopLock);
      if (((this->runCounter).super___atomic_base<int>._M_i < 1) &&
         ((this->nullwork)._M_t.
          super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
          ._M_t.
          super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
          .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl != (work *)0x0)) {
        LOCK();
        (this->terminateLoop)._M_base._M_i = true;
        UNLOCK();
        std::__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
        reset((__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
               *)&this->nullwork,(pointer)0x0);
        asio::io_context::stop
                  ((this->ictx)._M_t.
                   super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                   .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
        while( true ) {
          local_28.__r = 0;
          fVar3 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1000l>>
                            (&(this->loopRet).super___basic_future<void>,&local_28);
          if (fVar3 != timeout) break;
          sched_yield();
        }
        std::__basic_future<void>::_M_get_result(&(this->loopRet).super___basic_future<void>);
        asio::io_context::restart
                  ((this->ictx)._M_t.
                   super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                   .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
        LOCK();
        (this->terminateLoop)._M_base._M_i = false;
        UNLOCK();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->runningLoopLock);
    }
  }
  return;
}

Assistant:

void AsioContextManager::haltContextLoop()
{
    if (isRunning()) {
        // std::cout << "context loop halted "<<ptr->runCounter<<"\n";
        if (--runCounter <= 0) {
            std::lock_guard<std::mutex> nullLock(runningLoopLock);
            //    std::cout << "calling halt on context loop \n";

            if (runCounter <= 0) {
                if (nullwork) {
                    terminateLoop = true;
                    nullwork.reset();
                    ictx->stop();
                    int lcnt = 0;
                    while (loopRet.wait_for(std::chrono::milliseconds(0)) ==
                           std::future_status::timeout) {
                        if (lcnt == 0) {
                            std::this_thread::yield();
                        } else {
                            std::this_thread::sleep_for(
                                std::chrono::milliseconds(50));
                            ++lcnt;
                            ictx->stop();
                        }
                    }
                    loopRet.get();
                    ictx->reset();  // prepare for future runs
                    terminateLoop = false;
                }
            }
        }
    } else {
        runCounter.store(0);
    }
}